

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall antlr::Parser::traceIn(Parser *this,char *rname)

{
  ostream *poVar1;
  Token *pTVar2;
  char *pcVar3;
  ostream *poVar4;
  ParserInputState *pPVar5;
  char *in_RSI;
  long *in_RDI;
  int i;
  TokenRefCount<antlr::Token> local_40;
  string local_38 [36];
  int local_14;
  char *local_10;
  
  *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
  local_10 = in_RSI;
  for (local_14 = 0; local_14 < (int)in_RDI[3]; local_14 = local_14 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"> ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1,"; LA(1)==");
  (**(code **)(*in_RDI + 0x18))(&local_40,in_RDI,1);
  pTVar2 = TokenRefCount<antlr::Token>::operator->(&local_40);
  (*pTVar2->_vptr_Token[4])(local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar4 = std::operator<<(poVar1,pcVar3);
  pPVar5 = RefCount<antlr::ParserInputState>::operator->
                     ((RefCount<antlr::ParserInputState> *)(in_RDI + 1));
  pcVar3 = "";
  if (0 < pPVar5->guessing) {
    pcVar3 = " [guessing]";
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  TokenRefCount<antlr::Token>::~TokenRefCount((TokenRefCount<antlr::Token> *)poVar1);
  return;
}

Assistant:

void Parser::traceIn(const char* rname)
{
	traceDepth++;

	for( int i = 0; i < traceDepth; i++ )
		ANTLR_USE_NAMESPACE(std)cout << " ";

	ANTLR_USE_NAMESPACE(std)cout << "> " << rname
		<< "; LA(1)==" << LT(1)->getText().c_str()
		<<	((inputState->guessing>0)?" [guessing]":"")
		<< ANTLR_USE_NAMESPACE(std)endl;
}